

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O2

Vec_Str_t *
Bmc_CollapseOne_int(sat_solver *pSat,int nVars,int nCubeLim,int nBTLimit,int fCanon,int fReverse,
                   int fVerbose)

{
  Vec_Int_t *p;
  sat_solver *s;
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Vec_Str_t *pVVar6;
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar7;
  abctime aVar8;
  char Fill;
  abctime time;
  abctime time_00;
  abctime time_01;
  abctime time_02;
  int iVar9;
  ulong uVar10;
  char *pcVar11;
  ulong uVar12;
  long lVar13;
  long nConfLimit;
  bool bVar14;
  uint local_e4;
  int pLits [2];
  Vec_Int_t *local_d0;
  sat_solver *local_c8;
  uint local_c0;
  int local_bc;
  abctime local_b8;
  long local_b0;
  Vec_Int_t *local_a8;
  Vec_Int_t *local_a0;
  Vec_Str_t *vSop [2];
  int local_78 [4];
  int local_68;
  int local_64;
  ulong local_60;
  abctime Time [2] [2];
  
  uVar12 = (ulong)(uint)nVars;
  local_c8 = pSat;
  local_c0 = nCubeLim;
  local_bc = nBTLimit;
  local_78[3] = fCanon;
  pVVar6 = Vec_StrAlloc(1000);
  vSop[0] = pVVar6;
  vSop[1] = Vec_StrAlloc(1000);
  iVar9 = nVars + 1;
  p_00 = Vec_IntAlloc(iVar9);
  pVVar7 = Vec_IntAlloc(iVar9);
  local_a0 = Vec_IntAlloc(iVar9);
  local_d0 = Vec_IntAlloc(iVar9);
  Time[1][0] = 0;
  Time[1][1] = 0;
  Time[0][0] = 0;
  Time[0][1] = 0;
  local_78[0] = 0;
  local_78[1] = 0;
  uVar10 = uVar12;
  local_64 = fReverse;
  if (fReverse == 0) {
    iVar9 = 0;
    uVar10 = 0;
    if (0 < nVars) {
      uVar10 = uVar12;
    }
    while (iVar1 = (int)uVar10, uVar10 = (ulong)(iVar1 - 1), iVar1 != 0) {
      Vec_IntPush(p_00,iVar9 + 3);
      iVar9 = iVar9 + 1;
    }
  }
  else {
    while (iVar9 = (int)uVar10, 0 < iVar9) {
      Vec_IntPush(p_00,iVar9 + 2);
      uVar10 = (ulong)(iVar9 - 1);
    }
  }
  nConfLimit = (long)local_bc;
  local_a8 = pVVar7;
  for (lVar13 = 0; lVar13 != 2; lVar13 = lVar13 + 1) {
    pLits[0] = (uint)lVar13 | 4;
    iVar9 = sat_solver_solve(local_c8,pLits,pLits + 1,nConfLimit,0,0,0);
    if (iVar9 == 0) {
      bVar14 = false;
LAB_00491def:
      iVar9 = 0;
      local_e4 = 0;
      pVVar7 = local_a8;
      goto LAB_00491df4;
    }
    if (iVar9 == -1) {
      pVVar6->nSize = 0;
      pcVar11 = " 1\n";
      if (lVar13 == 0) {
        pcVar11 = " 0\n";
      }
      Vec_StrPrintStr(pVVar6,pcVar11);
      Vec_StrPush(pVVar6,'\0');
      bVar14 = true;
      goto LAB_00491def;
    }
    Vec_StrPush(vSop[lVar13],'\0');
  }
  local_b8 = 0;
  pVVar7 = local_a8;
  local_60 = uVar12;
  for (local_e4 = 0; nVars = (int)uVar12, (int)local_e4 < (int)local_c0 || local_c0 == 0;
      local_e4 = local_e4 + 1) {
    lVar13 = 0;
    while (nVars = (int)uVar12, lVar13 != 2) {
      if (fVerbose != 0) {
        local_b8 = Abc_Clock();
      }
      s = local_c8;
      iVar9 = p_00->nSize;
      sat_solver_clean_polarity(local_c8,p_00->pArray,iVar9);
      pLits[0] = (uint)lVar13 | 4;
      local_68 = (&DAT_00810d78)[lVar13];
      pLits[1] = Abc_Var2Lit(local_68,1);
      iVar1 = sat_solver_solve(s,pLits,(lit *)&local_d0,0,0,0,0);
      if (fVerbose != 0) {
        aVar8 = Abc_Clock();
        Time[lVar13][0] = Time[lVar13][0] + (aVar8 - local_b8);
      }
      local_b0 = lVar13;
      if (iVar1 == -1) {
LAB_00491d71:
        local_78[local_b0] = 1;
        break;
      }
      if (iVar1 == 0) {
        bVar14 = false;
        iVar9 = 0;
        goto LAB_00491df4;
      }
      pVVar7->nSize = 0;
      iVar1 = 0;
      if (iVar9 < 1) {
        iVar9 = 0;
        iVar1 = 0;
      }
      for (; iVar9 != iVar1; iVar1 = iVar1 + 1) {
        iVar2 = Vec_IntEntry(p_00,iVar1);
        uVar3 = sat_solver_var_value(local_c8,iVar2);
        iVar2 = Abc_Var2Lit(iVar2,uVar3 ^ 1);
        Vec_IntPush(pVVar7,iVar2);
      }
      if (fVerbose != 0) {
        local_b8 = Abc_Clock();
      }
      lVar13 = local_b0;
      iVar9 = Bmc_CollapseExpand(local_c8,(sat_solver *)0x0,pVVar7,local_a0,local_d0,local_bc,
                                 local_78[3],5 - (int)local_b0);
      if (fVerbose != 0) {
        aVar8 = Abc_Clock();
        Time[lVar13][1] = Time[lVar13][1] + (aVar8 - local_b8);
      }
      if (iVar9 < 0) {
        iVar9 = 0;
        bVar14 = false;
        goto LAB_00491df4;
      }
      pVVar6 = vSop[lVar13];
      Vec_StrPop(pVVar6);
      iVar9 = pVVar6->nSize;
      Vec_StrFillExtra(pVVar6,nVars + iVar9 + 4,Fill);
      Vec_StrWriteEntry(pVVar6,nVars + iVar9,' ');
      iVar2 = 0;
      Vec_StrWriteEntry(pVVar6,nVars + iVar9 + 1,(lVar13 == 0) + '0');
      Vec_StrWriteEntry(pVVar6,nVars + iVar9 + 2,'\n');
      Vec_StrWriteEntry(pVVar6,nVars + iVar9 + 3,'\0');
      p = local_d0;
      local_d0->nSize = 0;
      iVar1 = Abc_Var2Lit(local_68,0);
      Vec_IntPush(p,iVar1);
      iVar1 = local_a0->nSize;
      if (iVar1 < 1) {
        iVar1 = 0;
      }
      for (; iVar1 != iVar2; iVar2 = iVar2 + 1) {
        uVar3 = Vec_IntEntry(local_a0,iVar2);
        iVar4 = Vec_IntEntry(pVVar7,uVar3);
        iVar5 = Abc_LitNot(iVar4);
        Vec_IntPush(local_d0,iVar5);
        pVVar7 = local_a8;
        iVar5 = ~uVar3 + nVars + iVar9;
        if (local_64 == 0) {
          iVar5 = uVar3 + iVar9;
        }
        iVar4 = Abc_LitIsCompl(iVar4);
        Vec_StrWriteEntry(pVVar6,iVar5,(byte)iVar4 ^ 0x31);
      }
      iVar9 = sat_solver_addclause(local_c8,local_d0->pArray,local_d0->pArray + local_d0->nSize);
      uVar12 = local_60;
      if (iVar9 != 1) {
        if (iVar9 != 0) {
          __assert_fail("status == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                        ,0x5d2,
                        "Vec_Str_t *Bmc_CollapseOne_int(sat_solver *, int, int, int, int, int, int)"
                       );
        }
        goto LAB_00491d71;
      }
      lVar13 = local_b0 + 1;
    }
    nVars = (int)uVar12;
    iVar1 = local_78[0];
    iVar9 = local_78[1];
    if (local_78[0] != 0 || local_78[1] != 0) goto LAB_00491f59;
  }
  iVar1 = 0;
  iVar9 = 0;
LAB_00491f59:
  bVar14 = iVar1 != 0;
LAB_00491df4:
  Vec_IntFree(p_00);
  Vec_IntFree(pVVar7);
  Vec_IntFree(local_a0);
  Vec_IntFree(local_d0);
  if ((bVar14) && (iVar9 != 0)) {
    __assert_fail("!fComplete[0] || !fComplete[1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                  ,0x5dc,
                  "Vec_Str_t *Bmc_CollapseOne_int(sat_solver *, int, int, int, int, int, int)");
  }
  if ((bool)(bVar14 | iVar9 != 0)) {
    pVVar6 = vSop[iVar9];
    vSop[iVar9] = (Vec_Str_t *)0x0;
    if (1 < local_e4) {
      Bmc_CollapseIrredundantFull(pVVar6,pVVar6->nSize / (int)(nVars + 3U),nVars);
    }
  }
  else {
    pVVar6 = (Vec_Str_t *)0x0;
  }
  if (fVerbose != 0) {
    printf("Processed output with %d supp vars. ",(ulong)(uint)nVars);
    if (pVVar6 == (Vec_Str_t *)0x0) {
      pcVar11 = "The resulting SOP exceeded %d cubes.\n";
      uVar10 = (ulong)local_c0;
    }
    else {
      pcVar11 = "The best cover contains %d cubes.\n";
      uVar10 = (long)pVVar6->nSize / (long)(int)(nVars + 3) & 0xffffffff;
    }
    printf(pcVar11,uVar10);
    Abc_PrintTime(0x8111c4,(char *)Time[0][0],time);
    Abc_PrintTime(0x8111d3,(char *)Time[0][1],time_00);
    Abc_PrintTime(0x8111e2,(char *)Time[1][0],time_01);
    Abc_PrintTime(0x8111f1,(char *)Time[1][1],time_02);
  }
  Vec_StrFreeP(vSop);
  Vec_StrFreeP(vSop + 1);
  return pVVar6;
}

Assistant:

Vec_Str_t * Bmc_CollapseOne_int( sat_solver * pSat, int nVars, int nCubeLim, int nBTLimit, int fCanon, int fReverse, int fVerbose )
{
    int fVeryVerbose = fVerbose;
    Vec_Str_t * vSop[2]   = { Vec_StrAlloc(1000),  Vec_StrAlloc(1000)  }, * vRes = NULL;
    Vec_Int_t * vVars = Vec_IntAlloc( nVars+1 );
    Vec_Int_t * vLits = Vec_IntAlloc( nVars+1 );
    Vec_Int_t * vNums = Vec_IntAlloc( nVars+1 );
    Vec_Int_t * vCube = Vec_IntAlloc( nVars+1 );
    int n, v, iVar, pLits[2], iCube = 0, Start, status;
    abctime clk = 0, Time[2][2] = {{0}};
    int fComplete[2] = {0};
    // variables
    int iOutVar    = 2;
    int iOOVars[2] = {0, 1};
//    int iOutVar    = 1;
//    int iOOVars[2] = {sat_solver_nvars(pSat) - 5, sat_solver_nvars(pSat) - 5 + 1};

    // collect CI variables (0 = onset enable, 1 = offset enable, 2 = output)
    int iCiVarBeg = 3;
//    int iCiVarBeg = sat_solver_nvars(pSat) - 5 - nVars;
    if ( fReverse )
        for ( v = nVars - 1; v >= 0; v-- )
            Vec_IntPush( vVars, iCiVarBeg + v );
    else
        for ( v = 0; v < nVars; v++ )
            Vec_IntPush( vVars, iCiVarBeg + v );

    // check that on-set/off-set is sat
    for ( n = 0; n < 2; n++ )
    {
        pLits[0] = Abc_Var2Lit( iOutVar, n ); // n=0 => F=1   n=1 => F=0
        status = sat_solver_solve( pSat, pLits, pLits + 1, nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            goto cleanup; // timeout
        if ( status == l_False )
        {
            Vec_StrClear( vSop[0] );
            Vec_StrPrintStr( vSop[0], n ? " 1\n" : " 0\n" );
            Vec_StrPush( vSop[0], '\0' );
            fComplete[0] = 1;
            goto cleanup; // const0/1
        }
        // start cover
        Vec_StrPush( vSop[n], '\0' );
    }

    // compute cube pairs
    for ( iCube = 0; nCubeLim == 0 || iCube < nCubeLim; iCube++ )
    {
        for ( n = 0; n < 2; n++ )
        {
            if ( fVeryVerbose ) clk = Abc_Clock();
            // get the assignment
            sat_solver_clean_polarity( pSat, Vec_IntArray(vVars), Vec_IntSize(vVars) );
            pLits[0] = Abc_Var2Lit( iOutVar, n );    // set output
            pLits[1] = Abc_Var2Lit( iOOVars[n], 1 ); // enable clauses
            status = sat_solver_solve( pSat, pLits, pLits + 2, 0, 0, 0, 0 );
            if ( fVeryVerbose ) Time[n][0] += Abc_Clock() - clk;
            if ( status == l_Undef )
                goto cleanup; // timeout
            if ( status == l_False )
            {
                fComplete[n] = 1;
                break;
            }
            // collect values
            Vec_IntClear( vLits );
            Vec_IntForEachEntry( vVars, iVar, v )
                Vec_IntPush( vLits, Abc_Var2Lit(iVar, !sat_solver_var_value(pSat, iVar)) );
            // expand the values
            if ( fVeryVerbose ) clk = Abc_Clock();
            status = Bmc_CollapseExpand( pSat, NULL, vLits, vNums, vCube, nBTLimit, fCanon, Abc_Var2Lit(iOutVar, !n) );
            if ( fVeryVerbose ) Time[n][1] += Abc_Clock() - clk;
            if ( status < 0 )
                goto cleanup; // timeout
            // collect cube
            Vec_StrPop( vSop[n] );
            Start = Vec_StrSize( vSop[n] );
            Vec_StrFillExtra( vSop[n], Start + nVars + 4, '-' );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 0, ' ' );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 1, (char)(n ? '0' : '1') );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 2, '\n' );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 3, '\0' );
            Vec_IntClear( vCube );
            Vec_IntPush( vCube, Abc_Var2Lit( iOOVars[n], 0 ) );
            Vec_IntForEachEntry( vNums, iVar, v )
            {
                int iLit = Vec_IntEntry( vLits, iVar );
                Vec_IntPush( vCube, Abc_LitNot(iLit) );
                if ( fReverse )
                    Vec_StrWriteEntry( vSop[n], Start + nVars - iVar - 1, (char)('0' + !Abc_LitIsCompl(iLit)) );
                else 
                    Vec_StrWriteEntry( vSop[n], Start + iVar, (char)('0' + !Abc_LitIsCompl(iLit)) );
            }
            // add cube
            status = sat_solver_addclause( pSat, Vec_IntArray(vCube), Vec_IntLimit(vCube) );
            if ( status == 0 )
            {
                fComplete[n] = 1;
                break;
            }
            assert( status == 1 );
        }
        if ( fComplete[0] || fComplete[1] )
            break;
    }
cleanup:
    Vec_IntFree( vVars );
    Vec_IntFree( vLits );
    Vec_IntFree( vNums );
    Vec_IntFree( vCube );
    assert( !fComplete[0] || !fComplete[1] );
    if ( fComplete[0] || fComplete[1] ) // one of the cover is computed
    {
        vRes = vSop[fComplete[1]]; vSop[fComplete[1]] = NULL;
        if ( iCube > 1 )
//            Bmc_CollapseIrredundant( vRes, Vec_StrSize(vRes)/(nVars +3), nVars );
            Bmc_CollapseIrredundantFull( vRes, Vec_StrSize(vRes)/(nVars +3), nVars );
    }
    if ( fVeryVerbose )
    {
        int fProfile = 0;
        printf( "Processed output with %d supp vars. ", nVars );
        if ( vRes == NULL )
            printf( "The resulting SOP exceeded %d cubes.\n", nCubeLim );
        else 
            printf( "The best cover contains %d cubes.\n", Vec_StrSize(vRes)/(nVars +3) );
        Abc_PrintTime( 1, "Onset  minterm", Time[0][0] );
        Abc_PrintTime( 1, "Onset  expand ", Time[0][1] );
        Abc_PrintTime( 1, "Offset minterm", Time[1][0] );
        Abc_PrintTime( 1, "Offset expand ", Time[1][1] );
        if ( fProfile )
        {
            Abc_PrintTime( 1, "Expand check1 ", clkCheck1 ); clkCheck1 = 0;
            Abc_PrintTime( 1, "Expand check2 ", clkCheck2 ); clkCheck2 = 0;
            Abc_PrintTime( 1, "Expand sat    ", clkCheckS ); clkCheckS = 0;
            Abc_PrintTime( 1, "Expand unsat  ", clkCheckU ); clkCheckU = 0;
        }
    }
    Vec_StrFreeP( &vSop[0] );
    Vec_StrFreeP( &vSop[1] );
    return vRes;
}